

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

double __thiscall
FC_BPNN::train_once(FC_BPNN *this,vector<double,_std::allocator<double>_> *sample,
                   vector<double,_std::allocator<double>_> *label)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *label_local;
  vector<double,_std::allocator<double>_> *sample_local;
  FC_BPNN *this_local;
  
  clear(this);
  setSample(this,sample);
  Forward(this);
  setLabel(this,label);
  Backward(this);
  dVar1 = getCost(this);
  return dVar1;
}

Assistant:

double FC_BPNN::train_once(const std::vector<double>& sample, const std::vector<double>& label)
{
	clear();
	setSample(sample);
	Forward();
	setLabel(label);
	Backward();
	return getCost();
}